

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  ulong uVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int mode;
  pointer pbVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer pbVar8;
  ulong uVar9;
  pointer local_4a8;
  pointer local_4a0;
  char *local_498;
  string local_490;
  string sourceDir;
  string binaryDir;
  string startLogFile;
  ostringstream cmCTestLog_msg_3;
  cmGeneratedFileStream ofs;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"called with incorrect number of arguments",
               (allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
LAB_001bbf90:
    std::__cxx11::string::~string((string *)&ofs);
    return false;
  }
  local_4a8 = (pointer)0x0;
  local_4a0 = (pointer)0x0;
  uVar9 = 0;
  local_498 = (char *)0x0;
  while (uVar9 < (ulong)((long)pbVar5 - (long)pbVar8 >> 5)) {
    bVar4 = std::operator==(pbVar8 + uVar9,"GROUP");
    if ((bVar4) ||
       (bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"TRACK"), bVar4))
    {
      uVar1 = uVar9 + 1;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar1)
         || ((bVar4 = std::operator==(pbVar8 + uVar1,"APPEND"), bVar4 ||
             (bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar1,"QUIET"),
             bVar4)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar6 = std::operator<<((ostream *)&ofs,
                                 (string *)
                                 ((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar6," argument missing group name");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
        return false;
      }
      cmCTest::SetSpecificGroup
                ((this->super_cmCTestCommand).CTest,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p);
      uVar9 = uVar9 + 2;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"APPEND");
      if (bVar4) {
        uVar9 = uVar9 + 1;
        this->CreateNewTag = false;
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"QUIET");
        if (bVar4) {
          uVar9 = uVar9 + 1;
          this->Quiet = true;
        }
        else if (local_498 == (char *)0x0) {
          local_498 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
          uVar9 = uVar9 + 1;
        }
        else if (local_4a0 == (pointer)0x0) {
          local_4a0 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9;
          uVar9 = uVar9 + 1;
        }
        else {
          if (local_4a8 != (pointer)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ofs,"Too many arguments",(allocator<char> *)&cmCTestLog_msg_3);
            cmCommand::SetError((cmCommand *)this,(string *)&ofs);
            goto LAB_001bbf90;
          }
          local_4a8 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9;
          uVar9 = uVar9 + 1;
        }
      }
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (local_4a0 == (pointer)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&cmCTestLog_msg_3);
    local_4a0 = (pointer)cmMakefile::GetDefinition(pcVar2,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  if (local_4a8 == (pointer)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"CTEST_BINARY_DIRECTORY",(allocator<char> *)&cmCTestLog_msg_3);
    local_4a8 = (pointer)cmMakefile::GetDefinition(pcVar2,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  if (local_4a0 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_001bbf90;
  }
  if (local_4a8 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_001bbf90;
  }
  if ((local_498 == (char *)0x0) && (this->CreateNewTag == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,
               "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
               ,(allocator<char> *)&cmCTestLog_msg_3);
    cmCommand::SetError((cmCommand *)this,(string *)&ofs);
    goto LAB_001bbf90;
  }
  cmsys::SystemTools::AddKeepPath(local_4a0);
  cmsys::SystemTools::AddKeepPath(local_4a8);
  cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
  cmsys::SystemTools::CollapseFullPath(&sourceDir,local_4a0);
  cmsys::SystemTools::CollapseFullPath(&binaryDir,local_4a8);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"SourceDirectory",&sourceDir,this->Quiet);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"BuildDirectory",&binaryDir,this->Quiet);
  if (local_498 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"Run dashboard with to-be-determined model");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Source directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_4a0);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Build directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_4a8);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x74,_cmCTestLog_msg_3,this->Quiet);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"Run dashboard with model ");
    poVar6 = std::operator<<(poVar6,local_498);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Source directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_4a0);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"   Build directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_4a8);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x6c,_cmCTestLog_msg_3,this->Quiet);
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  pcVar7 = cmCTest::GetSpecificGroup((this->super_cmCTestCommand).CTest);
  if (pcVar7 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,"   Group: ");
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x79,_cmCTestLog_msg_3,this->Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  }
  std::operator+(&startLogFile,&binaryDir,"/Testing/Temporary/LastStart.log");
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,&startLogFile,false,None);
  if (((&ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar4 = InitialCheckout(this,(ostream *)&ofs,&sourceDir);
    if (bVar4) {
      bVar4 = cmsys::SystemTools::FileIsDirectory(&sourceDir);
      if (bVar4) {
        cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
        cmCTest::SetSuppressUpdatingCTestConfiguration((this->super_cmCTestCommand).CTest,true);
        if (local_498 == (char *)0x0) {
          mode = -1;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_3,local_498,(allocator<char> *)&local_490);
          mode = cmCTest::GetTestModelFromString((string *)&cmCTestLog_msg_3);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        }
        cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,mode);
        cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
        bVar4 = cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
        goto LAB_001bc4bf;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"given source path\n");
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = std::operator<<(poVar6,(string *)&sourceDir);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"which is not an existing directory.  ");
      std::operator<<(poVar6,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_490);
      goto LAB_001bc420;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Cannot create log file: LastStart.log");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x81,local_490._M_dataplus._M_p,false);
LAB_001bc420:
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
  }
  bVar4 = false;
LAB_001bc4bf:
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  std::__cxx11::string::~string((string *)&startLogFile);
  std::__cxx11::string::~string((string *)&binaryDir);
  std::__cxx11::string::~string((string *)&sourceDir);
  return bVar4;
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  cmValue src_dir;
  cmValue bld_dir;

  while (cnt < args.size()) {
    if (args[cnt] == "GROUP" || args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        std::ostringstream e;
        e << args[cnt - 1] << " argument missing group name";
        this->SetError(e.str());
        return false;
      }
      this->CTest->SetSpecificGroup(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = cmValue(args[cnt]);
      cnt++;
    } else if (!bld_dir) {
      bld_dir = cmValue(args[cnt]);
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(*src_dir);
  cmSystemTools::AddKeepPath(*bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(*src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(*bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir,
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir, this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  }
  const char* group = this->CTest->GetSpecificGroup();
  if (group) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Group: " << group << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}